

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

void __thiscall crnlib::crn_comp::~crn_comp(crn_comp *this)

{
  uchar *puVar1;
  void *pvVar2;
  uint *puVar3;
  selector_indices_details *p;
  endpoint_indices_details *p_00;
  unsigned_long_long *p_01;
  level_details *p_02;
  long lVar4;
  
  (this->super_itexture_comp)._vptr_itexture_comp = (_func_int **)&PTR__crn_comp_001d28b0;
  puVar1 = (this->m_packed_alpha_selectors).m_p;
  if (puVar1 != (uchar *)0x0) {
    crnlib_free(puVar1);
  }
  puVar1 = (this->m_packed_alpha_endpoints).m_p;
  if (puVar1 != (uchar *)0x0) {
    crnlib_free(puVar1);
  }
  puVar1 = (this->m_packed_color_selectors).m_p;
  if (puVar1 != (uchar *)0x0) {
    crnlib_free(puVar1);
  }
  puVar1 = (this->m_packed_color_endpoints).m_p;
  if (puVar1 != (uchar *)0x0) {
    crnlib_free(puVar1);
  }
  puVar1 = (this->m_packed_data_models).m_p;
  if (puVar1 != (uchar *)0x0) {
    crnlib_free(puVar1);
  }
  lVar4 = 0;
  do {
    pvVar2 = *(void **)((long)&this->m_packed_blocks[0xf].m_p + lVar4);
    if (pvVar2 != (void *)0x0) {
      crnlib_free(pvVar2);
    }
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -0x100);
  lVar4 = 0;
  do {
    static_huffman_data_model::~static_huffman_data_model
              ((static_huffman_data_model *)((long)this->m_packed_blocks + lVar4 + -0x38));
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x70);
  lVar4 = 0;
  do {
    pvVar2 = *(void **)((long)&this->m_selector_index_hist[1].m_hist.m_p + lVar4);
    if (pvVar2 != (void *)0x0) {
      crnlib_free(pvVar2);
    }
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -0x20);
  lVar4 = 0;
  do {
    pvVar2 = *(void **)((long)&this->m_selector_remaping[1].m_p + lVar4);
    if (pvVar2 != (void *)0x0) {
      crnlib_free(pvVar2);
    }
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -0x20);
  lVar4 = 0;
  do {
    static_huffman_data_model::~static_huffman_data_model
              ((static_huffman_data_model *)((long)this->m_selector_remaping + lVar4 + -0x38));
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x70);
  lVar4 = 0;
  do {
    pvVar2 = *(void **)((long)&this->m_endpoint_index_hist[1].m_hist.m_p + lVar4);
    if (pvVar2 != (void *)0x0) {
      crnlib_free(pvVar2);
    }
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -0x20);
  lVar4 = 0;
  do {
    pvVar2 = *(void **)((long)&this->m_endpoint_remaping[1].m_p + lVar4);
    if (pvVar2 != (void *)0x0) {
      crnlib_free(pvVar2);
    }
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -0x20);
  static_huffman_data_model::~static_huffman_data_model(&this->m_reference_dm);
  puVar3 = (this->m_reference_hist).m_hist.m_p;
  if (puVar3 != (uint *)0x0) {
    crnlib_free(puVar3);
  }
  dxt_hc::~dxt_hc(&this->m_hvq);
  puVar1 = (this->m_comp_data).m_p;
  if (puVar1 != (uchar *)0x0) {
    crnlib_free(puVar1);
  }
  p = (this->m_selector_indices).m_p;
  if (p != (selector_indices_details *)0x0) {
    crnlib_free(p);
  }
  p_00 = (this->m_endpoint_indices).m_p;
  if (p_00 != (endpoint_indices_details *)0x0) {
    crnlib_free(p_00);
  }
  p_01 = (this->m_alpha_selectors).m_p;
  if (p_01 != (unsigned_long_long *)0x0) {
    crnlib_free(p_01);
  }
  puVar3 = (this->m_color_selectors).m_p;
  if (puVar3 != (uint *)0x0) {
    crnlib_free(puVar3);
  }
  puVar3 = (this->m_alpha_endpoints).m_p;
  if (puVar3 != (uint *)0x0) {
    crnlib_free(puVar3);
  }
  puVar3 = (this->m_color_endpoints).m_p;
  if (puVar3 != (uint *)0x0) {
    crnlib_free(puVar3);
  }
  p_02 = (this->m_levels).m_p;
  if (p_02 != (level_details *)0x0) {
    crnlib_free(p_02);
  }
  lVar4 = 0x1200;
  do {
    pvVar2 = *(void **)((long)((crn_comp *)
                              (((crn_comp *)(((crn_comp *)(this->m_images + -1))->m_images + -1))->
                               m_images + -1))->m_images + lVar4 + 0xfffffffffffffff0U);
    if (pvVar2 != (void *)0x0) {
      crnlib_free(pvVar2);
    }
    lVar4 = lVar4 + -0x30;
  } while (lVar4 != 0);
  task_pool::~task_pool(&this->m_task_pool);
  return;
}

Assistant:

crn_comp::~crn_comp()
    {
    }